

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Scene::selectHalfedge(Scene *this)

{
  Face *this_00;
  Edge *this_01;
  HalfedgeIter *pHVar1;
  Halfedge *pHVar2;
  HalfedgeIter local_30;
  HalfedgeIter h;
  Vertex *v;
  Edge *e;
  Face *f;
  Scene *this_local;
  
  if ((this->selected).element != (HalfedgeElement *)0x0) {
    this_00 = HalfedgeElement::getFace((this->selected).element);
    this_01 = HalfedgeElement::getEdge((this->selected).element);
    h._M_node = (_List_node_base *)HalfedgeElement::getVertex((this->selected).element);
    std::_List_iterator<CMU462::Halfedge>::_List_iterator(&local_30);
    if (this_00 == (Face *)0x0) {
      if (this_01 == (Edge *)0x0) {
        if (h._M_node == (_List_node_base *)0x0) {
          return;
        }
        pHVar1 = Vertex::halfedge((Vertex *)h._M_node);
        local_30._M_node = pHVar1->_M_node;
      }
      else {
        pHVar1 = Edge::halfedge(this_01);
        local_30._M_node = pHVar1->_M_node;
      }
    }
    else {
      pHVar1 = Face::halfedge(this_00);
      local_30._M_node = pHVar1->_M_node;
    }
    pHVar2 = elementAddress(local_30);
    (this->selected).element = &pHVar2->super_HalfedgeElement;
  }
  return;
}

Assistant:

void Scene::selectHalfedge()
{
   if( selected.element )
   {
      Face   *f = selected.element->getFace();
      Edge   *e = selected.element->getEdge();
      Vertex *v = selected.element->getVertex();
      HalfedgeIter h;
      if (f != nullptr) {
         h = f->halfedge();
      } else if ( e != nullptr) {
         h = e->halfedge();
      } else if (v != nullptr) {
         h = v->halfedge();
      } else {
         return;
      }
      selected.element = elementAddress(h);
   }
}